

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall cs222::Parser::parseMemory(Parser *this,string *token,Operand *operand)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  Parser *pPVar5;
  string *this_00;
  allocator local_7d;
  Type local_7c;
  string location;
  string indexedX;
  
  bVar2 = parseLocation(this,token,operand);
  bVar4 = true;
  if (bVar2) {
    return true;
  }
  cVar1 = *(token->_M_dataplus)._M_p;
  if ((cVar1 == '@') || (cVar1 == '#')) {
    pPVar5 = (Parser *)&location;
    std::__cxx11::string::substr((ulong)&location,(ulong)token);
    bVar2 = parseLocation(pPVar5,&location,operand);
    std::__cxx11::string::~string((string *)&location);
    if (bVar2) {
      if (cVar1 == '#') {
        std::bitset<6UL>::set(&this->flags,4,true);
        return true;
      }
      if (cVar1 != '@') {
        return true;
      }
      std::bitset<6UL>::set(&this->flags,5,true);
      return true;
    }
LAB_001122e2:
    bVar4 = false;
  }
  else {
    lVar3 = std::__cxx11::string::find((char)token,0x2c);
    if (lVar3 == -1) {
LAB_001121fe:
      pPVar5 = this;
      bVar2 = parseLiteral(this,token,operand);
      if (bVar2) {
        return true;
      }
      bVar2 = parseConstant(pPVar5,token,operand);
      if (bVar2) {
        return true;
      }
      bVar2 = std::operator==(token,"*");
      if (bVar2) {
        local_7c = LOCCTR;
        std::__cxx11::string::string((string *)&indexedX,"",&local_7d);
        Operand::Operand((Operand *)&location,&local_7c,&indexedX);
        Operand::operator=(operand,(Operand *)&location);
        std::__cxx11::string::~string((string *)&location._M_string_length);
        this_00 = &indexedX;
      }
      else {
        bVar2 = parseExpression(this,token);
        if (!bVar2) goto LAB_001122e2;
        indexedX._M_dataplus._M_p._0_4_ = 8;
        Operand::Operand((Operand *)&location,(Type *)&indexedX,token);
        Operand::operator=(operand,(Operand *)&location);
        this_00 = (string *)&location._M_string_length;
      }
    }
    else {
      std::__cxx11::string::substr((ulong)&location,(ulong)token);
      pPVar5 = (Parser *)&indexedX;
      std::__cxx11::string::substr((ulong)pPVar5,(ulong)token);
      bVar2 = parseLocation(pPVar5,&location,operand);
      if ((!bVar2) || (bVar2 = std::operator==(&indexedX,"X"), !bVar2)) {
        std::__cxx11::string::~string((string *)&indexedX);
        std::__cxx11::string::~string((string *)&location);
        goto LAB_001121fe;
      }
      std::bitset<6UL>::set(&this->flags,3,true);
      std::__cxx11::string::~string((string *)&indexedX);
      this_00 = &location;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return bVar4;
}

Assistant:

bool Parser::parseMemory(const std::string& token, Operand& operand)
    {
        if (parseLocation(token, operand))
        {
            return true;
        }

        const char prefix = token[0];
        if (prefix == '@' || prefix == '#')
        {
            if (!parseLocation(token.substr(1), operand))
            {
                return false;
            }
            switch (prefix)
            {
                case '@':
                    flags.set(Instruction::FLAG_INDIRECT);
                    break;
                case '#':
                    flags.set(Instruction::FLAG_IMMEDIATE);
                    break;
            }
            return true;
        }

        size_t commaPosition = token.find(',');
        if (commaPosition != std::string::npos)
        {
            std::string location = token.substr(0, commaPosition);
            std::string indexedX = token.substr(commaPosition + 1);
            if (parseLocation(location, operand) && indexedX == "X")
            {
                flags.set(Instruction::FLAG_INDEXED);
                return true;
            }
        }

        if (parseLiteral(token, operand) || parseConstant(token, operand))
        {
            return true;
        }

        if (token == "*")
        {
            operand = Operand(Operand::LOCCTR);
            return true;
        }

        if (parseExpression(token))
        {
            operand = Operand(Operand::EXPRESSION, token);
            return true;
        }

        return false;
    }